

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

void __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::~SimpleHashTable(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                   *this)

{
  SimpleHashEntry<Js::JavascriptPromise_*,_int> *pSVar1;
  EntryType *current;
  EntryType *next;
  EntryType *entry;
  uint i;
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  *this_local;
  
  for (entry._4_4_ = 0; entry._4_4_ < this->size; entry._4_4_ = entry._4_4_ + 1) {
    next = this->table[entry._4_4_];
    while (next != (EntryType *)0x0) {
      pSVar1 = next->next;
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,SimpleHashEntry<Js::JavascriptPromise*,int>>
                (this->allocator,next);
      next = pSVar1;
    }
  }
  while (this->free != (EntryType *)0x0) {
    pSVar1 = this->free;
    this->free = pSVar1->next;
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,SimpleHashEntry<Js::JavascriptPromise*,int>>
              (this->allocator,pSVar1);
  }
  Memory::DeleteArray<Memory::HeapAllocator,SimpleHashEntry<Js::JavascriptPromise*,int>*>
            (this->allocator,(ulong)this->size,this->table);
  return;
}

Assistant:

~SimpleHashTable()
    {
        for (uint i = 0; i < size; i++)
        {
            EntryType * entry = table[i];
            while (entry != nullptr)
            {
                EntryType * next = entry->next;
                AllocatorDelete(TAllocator, allocator, entry);
                entry = next;
            }
        }

        while(free)
        {
            EntryType* current = free;
            free = current->next;
            AllocatorDelete(TAllocator, allocator, current);
        }
        AllocatorDeleteArray(TAllocator, allocator,  size, table);
    }